

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_root.cpp
# Opt level: O0

error_code __thiscall pstore::exchange::import_ns::root::begin_object(root *this)

{
  error_code eVar1;
  root *this_local;
  
  eVar1 = rule::push<(anonymous_namespace)::root_object>(&this->super_rule);
  eVar1._4_4_ = 0;
  return eVar1;
}

Assistant:

std::error_code root::begin_object () { return this->push<root_object> (); }